

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directories.cpp
# Opt level: O2

string * directories::MADPGetProblemFilename(string *__return_storage_ptr__,string *problem)

{
  pointer pbVar1;
  pointer pbVar2;
  int iVar3;
  ulong uVar4;
  DIR *__dirp;
  dirent *pdVar5;
  ostream *poVar6;
  E *pEVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extensions;
  string s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream ss;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [23];
  
  if (problem->_M_string_length == 0) {
    pEVar7 = (E *)__cxa_allocate_exception(0x28);
    E::E(pEVar7,"No problem file specified.");
LAB_00408c56:
    __cxa_throw(pEVar7,&E::typeinfo,E::~E);
  }
  uVar4 = std::__cxx11::string::find_last_of((char *)problem,0x52b543);
  if ((uVar4 == 0) || (problem->_M_string_length - 1 <= uVar4)) {
    MADPGetProblemsDir_abi_cxx11_();
    __dirp = opendir(_ss);
    std::__cxx11::string::~string((string *)&ss);
    if (__dirp == (DIR *)0x0) {
      pEVar7 = (E *)__cxa_allocate_exception(0x28);
      E::E(pEVar7,
           "Could not open problems directory. Please create a symbolic link from ~/.madp/problems to the problems directory in your MADP tree (see README for details)."
          );
      goto LAB_00408c56;
    }
    _ss = (pointer)local_1a8;
    extensions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1a8[0]._M_local_buf[0] = '\0';
    extensions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    extensions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&s,"pgmx",(allocator<char> *)&local_1f8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&extensions,&s);
    std::__cxx11::string::~string((string *)&s);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&s,"dpomdp",(allocator<char> *)&local_1f8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&extensions,&s);
    std::__cxx11::string::~string((string *)&s);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&s,"POMDP",(allocator<char> *)&local_1f8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&extensions,&s);
    std::__cxx11::string::~string((string *)&s);
    std::__cxx11::string::_M_assign((string *)&ss);
    do {
      pbVar2 = extensions.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar1 = extensions.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (extensions.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          extensions.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        closedir(__dirp);
        break;
      }
      std::operator+(&local_1f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,".");
      std::operator+(&s,&local_1f8,
                     extensions.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish + -1);
      std::__cxx11::string::~string((string *)&local_1f8);
      do {
        pdVar5 = readdir(__dirp);
        if (pdVar5 == (dirent *)0x0) {
          rewinddir(__dirp);
          this = extensions.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
          extensions.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = this;
          goto LAB_00408bc8;
        }
        iVar3 = std::__cxx11::string::compare((char *)&s);
      } while (iVar3 != 0);
      closedir(__dirp);
      MADPGetProblemsDir_abi_cxx11_();
      std::operator+(&local_1f8,&local_1d8,"/");
      std::operator+(__return_storage_ptr__,&local_1f8,&s);
      std::__cxx11::string::~string((string *)&local_1f8);
      this = &local_1d8;
LAB_00408bc8:
      std::__cxx11::string::~string((string *)this);
      std::__cxx11::string::~string((string *)&s);
    } while (pdVar5 == (dirent *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&extensions);
    std::__cxx11::string::~string((string *)&ss);
    if (pbVar2 == pbVar1) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar6 = std::operator<<((ostream *)local_1a8[0]._M_local_buf,
                               "Problem file not found (problem = ");
      poVar6 = std::operator<<(poVar6,(string *)problem);
      std::operator<<(poVar6,")");
      pEVar7 = (E *)__cxa_allocate_exception(0x28);
      E::E(pEVar7,&ss);
      __cxa_throw(pEVar7,&E::typeinfo,E::~E);
    }
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)problem);
  }
  return __return_storage_ptr__;
}

Assistant:

string directories::MADPGetProblemFilename(const string & problem)
{
    if (problem.empty())
        throw(E("No problem file specified."));

    size_t pos = problem.find_last_of(".");

    if(pos < problem.length()-1 && pos > 0){ //non-empty extension
        return(problem);
    }else{
        DIR *d = opendir (MADPGetProblemsDir().c_str());
	if (d == NULL)
	    throw(E("Could not open problems directory. Please create a symbolic link from ~/.madp/problems to the problems directory in your MADP tree (see README for details)."));

	string problemName;
        struct dirent *ep;
        vector<string> extensions; //default extensions. Add more here if needed.
        extensions.push_back("pgmx"); 
        extensions.push_back("dpomdp");
        extensions.push_back("POMDP");
        problemName = problem;
        while(extensions.size() > 0)
        {
            string s = problemName + "." + extensions.back();
            while ((ep = readdir (d)))
            {
                if(!s.compare(ep->d_name))
	        {
                    closedir (d);
                    return(MADPGetProblemsDir() + "/" + s);
	        }
            }
            rewinddir (d);
            extensions.pop_back();
        }
	closedir (d);
    }

    stringstream ss;
    ss << "Problem file not found (problem = " << problem << ")";
    throw(E(ss));
    return(problem);
}